

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-target.inc.c
# Opt level: O1

_Bool tcg_out_dupm_vec(TCGContext_conflict9 *s,TCGType_conflict type,uint vece,TCGReg r,TCGReg base,
                      intptr_t offset)

{
  tcg_insn_unit *ptVar1;
  byte *pbVar2;
  undefined1 extraout_AL;
  _Bool _Var3;
  TCGReg TVar4;
  uint vece_00;
  int opc;
  
  if (!have_avx2_tricore) {
    switch(vece) {
    case 0:
      TVar4 = TCG_REG_EAX;
      if (0 < (int)base) {
        TVar4 = base;
      }
      ptVar1 = s->code_ptr;
      s->code_ptr = ptVar1 + 1;
      *ptVar1 = 0xc4;
      pbVar2 = s->code_ptr;
      s->code_ptr = pbVar2 + 1;
      *pbVar2 = (char)((r & TCG_REG_R8) << 4) + ((byte)TVar4 & 8) * '\x04' ^ 0xe3;
      pbVar2 = s->code_ptr;
      s->code_ptr = pbVar2 + 1;
      *pbVar2 = (char)r * '\b' & 0x78U ^ 0x79;
      ptVar1 = s->code_ptr;
      s->code_ptr = ptVar1 + 1;
      *ptVar1 = ' ';
      tcg_out_sib_offset(s,r,base,-1,0,offset);
      ptVar1 = s->code_ptr;
      s->code_ptr = ptVar1 + 1;
      *ptVar1 = '\0';
      vece_00 = 0;
      break;
    case 1:
      TVar4 = TCG_REG_EAX;
      if (0 < (int)base) {
        TVar4 = base;
      }
      tcg_out_vex_opc(s,0x5c4,r,r,TVar4,(int)offset);
      tcg_out_sib_offset(s,r,base,-1,0,offset);
      ptVar1 = s->code_ptr;
      s->code_ptr = ptVar1 + 1;
      *ptVar1 = '\0';
      vece_00 = 1;
      break;
    case 2:
      TVar4 = TCG_REG_EAX;
      if (0 < (int)base) {
        TVar4 = base;
      }
      ptVar1 = s->code_ptr;
      s->code_ptr = ptVar1 + 1;
      *ptVar1 = 0xc4;
      pbVar2 = s->code_ptr;
      s->code_ptr = pbVar2 + 1;
      *pbVar2 = (char)((r & TCG_REG_R8) << 4) + ((byte)TVar4 & 8) * '\x04' ^ 0xe2;
      ptVar1 = s->code_ptr;
      s->code_ptr = ptVar1 + 1;
      *ptVar1 = 'y';
      ptVar1 = s->code_ptr;
      s->code_ptr = ptVar1 + 1;
      *ptVar1 = '\x18';
      goto LAB_00d10279;
    case 3:
      TVar4 = TCG_REG_EAX;
      if (0 < (int)base) {
        TVar4 = base;
      }
      opc = 0x40112;
      goto LAB_00d10270;
    default:
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/i386/tcg-target.inc.c"
                 ,0x3b2,(char *)0x0);
    }
    _Var3 = tcg_out_dup_vec(s,type,vece_00,r,r);
    return _Var3;
  }
  opc = (uint)(type == TCG_TYPE_V256) * 0x80000 + avx2_dup_insn[vece];
  TVar4 = TCG_REG_EAX;
  if (0 < (int)base) {
    TVar4 = base;
  }
LAB_00d10270:
  tcg_out_vex_opc(s,opc,r,0,TVar4,(int)offset);
LAB_00d10279:
  tcg_out_sib_offset(s,r,base,-1,0,offset);
  return (_Bool)extraout_AL;
}

Assistant:

static bool tcg_out_dupm_vec(TCGContext *s, TCGType type, unsigned vece,
                             TCGReg r, TCGReg base, intptr_t offset)
{
    if (have_avx2) {
        int vex_l = (type == TCG_TYPE_V256 ? P_VEXL : 0);
        tcg_out_vex_modrm_offset(s, avx2_dup_insn[vece] + vex_l,
                                 r, 0, base, offset);
    } else {
        switch (vece) {
        case MO_64:
            tcg_out_vex_modrm_offset(s, OPC_MOVDDUP, r, 0, base, offset);
            break;
        case MO_32:
            tcg_out_vex_modrm_offset(s, OPC_VBROADCASTSS, r, 0, base, offset);
            break;
        case MO_16:
            tcg_out_vex_modrm_offset(s, OPC_VPINSRW, r, r, base, offset);
            tcg_out8(s, 0); /* imm8 */
            tcg_out_dup_vec(s, type, vece, r, r);
            break;
        case MO_8:
            tcg_out_vex_modrm_offset(s, OPC_VPINSRB, r, r, base, offset);
            tcg_out8(s, 0); /* imm8 */
            tcg_out_dup_vec(s, type, vece, r, r);
            break;
        default:
            g_assert_not_reached();
        }
    }
    return true;
}